

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx512::forward
          (Convolution1D_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  Option *opt_00;
  Mat local_88;
  ulong local_38;
  
  local_38 = bottom_blob->elemsize;
  iVar1 = (this->super_Convolution1D).kernel_w;
  iVar2 = (this->super_Convolution1D).dilation_w;
  iVar3 = bottom_blob->elempack;
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize._0_4_ = 0;
  local_88._20_8_ = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  Convolution1D::make_padding(&this->super_Convolution1D,bottom_blob,&local_88,opt);
  iVar5 = -100;
  if ((local_88.data != (void *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
    uVar6 = 1;
    if (opt->use_packing_layout == true) {
      uVar6 = (this->super_Convolution1D).num_output;
      if ((uVar6 & 0xf) == 0) {
        uVar6 = 0x10;
      }
      else if ((uVar6 & 7) == 0) {
        uVar6 = 8;
      }
      else {
        uVar6 = (uint)((uVar6 & 3) == 0) * 3 + 1;
      }
    }
    opt_00 = (Option *)0x57520d;
    Mat::create(top_blob,(local_88.w + ~((iVar1 + -1) * iVar2)) /
                         (this->super_Convolution1D).stride_w + 1,
                (this->super_Convolution1D).num_output / (int)uVar6,
                (ulong)uVar6 * (local_38 / (ulong)(long)iVar3),uVar6,opt->blob_allocator);
    iVar5 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      convolution1d_packed
                (&local_88,top_blob,&this->weight_data_tm,&(this->super_Convolution1D).bias_data,
                 (this->super_Convolution1D).kernel_w,(this->super_Convolution1D).dilation_w,
                 (this->super_Convolution1D).stride_w,(this->super_Convolution1D).activation_type,
                 &(this->super_Convolution1D).activation_params,opt_00);
      iVar5 = 0;
    }
  }
  piVar4 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        if (local_88.data != (void *)0x0) {
          free(local_88.data);
        }
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar5;
}

Assistant:

int Convolution1D_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}